

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtptcptransmitter.cpp
# Opt level: O3

int __thiscall
jrtplib::RTPTCPTransmitter::PollSocket(RTPTCPTransmitter *this,SocketType sock,SocketData *sdata)

{
  size_t *psVar1;
  RTPMemoryManager *pRVar2;
  int iVar3;
  _List_node_base *p_Var4;
  _List_node_base *p_Var5;
  _List_node_base *p_Var6;
  RTCPCommonHeader *rtcpheader;
  bool bVar7;
  bool complete;
  timespec tpMono_1;
  long local_88;
  timespec local_80;
  _List_node_base *local_70;
  _List_node_base *local_68;
  _List_node_base *local_60;
  list<jrtplib::RTPRawPacket_*,_std::allocator<jrtplib::RTPRawPacket_*>_> *local_58;
  int *local_50;
  SocketData *local_48;
  timespec local_40;
  
  local_88 = 0;
  ioctl(sock,0x541b,&local_88);
  if (local_88 != 0) {
    local_50 = &sdata->m_lengthBufferOffset;
    local_58 = &this->m_rawpacketlist;
    local_60 = (_List_node_base *)&PTR_CreateCopy_0013ccf8;
    local_48 = sdata;
    do {
      if (RTPTime::CurrentTime()::s_initialized == '\0') {
        RTPTime::CurrentTime()::s_initialized = '\x01';
        clock_gettime(0,&local_80);
        clock_gettime(1,&local_40);
        local_68 = (_List_node_base *)
                   ((double)local_80.tv_nsec * 1e-09 +
                   (double)CONCAT71(local_80.tv_sec._1_7_,(char)local_80.tv_sec));
        RTPTime::CurrentTime()::s_startOffet =
             (double)local_68 - ((double)local_40.tv_nsec * 1e-09 + (double)local_40.tv_sec);
      }
      else {
        clock_gettime(1,&local_80);
        local_68 = (_List_node_base *)
                   ((double)local_80.tv_nsec * 1e-09 +
                    (double)CONCAT71(local_80.tv_sec._1_7_,(char)local_80.tv_sec) +
                   RTPTime::CurrentTime()::s_startOffet);
      }
      iVar3 = (int)local_88;
      if (0x10000 < (int)local_88) {
        iVar3 = 0x10001;
      }
      local_80.tv_sec._0_1_ = '\0';
      iVar3 = SocketData::ProcessAvailableBytes
                        (sdata,sock,iVar3,(bool *)&local_80,
                         (this->super_RTPTransmitter).super_RTPMemoryObject.mgr);
      if (iVar3 < 0) {
        return iVar3;
      }
      if ((char)local_80.tv_sec == '\x01') {
        p_Var6 = (_List_node_base *)sdata->m_pDataBuffer;
        sdata->m_pDataBuffer = (uint8_t *)0x0;
        if (p_Var6 != (_List_node_base *)0x0) {
          local_70 = (_List_node_base *)(long)sdata->m_dataLength;
          local_50[0] = 0;
          local_50[1] = 0;
          *(undefined8 *)(local_50 + 2) = 0;
          local_50[4] = 0;
          pRVar2 = (this->super_RTPTransmitter).super_RTPMemoryObject.mgr;
          if (pRVar2 == (RTPMemoryManager *)0x0) {
            p_Var4 = (_List_node_base *)operator_new(0x10);
          }
          else {
            p_Var4 = (_List_node_base *)(**(code **)(*(long *)pRVar2 + 0x10))(pRVar2,0x10,0x17);
          }
          *(undefined4 *)&p_Var4->_M_prev = 4;
          p_Var4->_M_next = local_60;
          *(SocketType *)((long)&p_Var4->_M_prev + 4) = sock;
          bVar7 = true;
          if (4 < (int)local_70) {
            bVar7 = (byte)(*(char *)((long)&p_Var6->_M_next + 1) + 0x33U) < 0xfb;
          }
          pRVar2 = (this->super_RTPTransmitter).super_RTPMemoryObject.mgr;
          if (pRVar2 == (RTPMemoryManager *)0x0) {
            p_Var5 = (_List_node_base *)operator_new(0x38);
          }
          else {
            p_Var5 = (_List_node_base *)(**(code **)(*(long *)pRVar2 + 0x10))(pRVar2,0x38,0x1b);
          }
          p_Var5->_M_prev =
               (_List_node_base *)(this->super_RTPTransmitter).super_RTPMemoryObject.mgr;
          p_Var5->_M_next = (_List_node_base *)&PTR__RTPRawPacket_0013c070;
          p_Var5[2]._M_next = local_68;
          p_Var5[1]._M_next = p_Var6;
          p_Var5[1]._M_prev = local_70;
          p_Var5[2]._M_prev = p_Var4;
          *(bool *)&p_Var5[3]._M_next = bVar7;
          p_Var6 = (_List_node_base *)operator_new(0x18);
          p_Var6[1]._M_next = p_Var5;
          std::__detail::_List_node_base::_M_hook(p_Var6);
          psVar1 = &(this->m_rawpacketlist).
                    super__List_base<jrtplib::RTPRawPacket_*,_std::allocator<jrtplib::RTPRawPacket_*>_>
                    ._M_impl._M_node._M_size;
          *psVar1 = *psVar1 + 1;
          sdata = local_48;
        }
      }
      local_88 = 0;
      ioctl(sock,0x541b,&local_88);
    } while (local_88 != 0);
  }
  return 0;
}

Assistant:

int RTPTCPTransmitter::PollSocket(SocketType sock, SocketData &sdata)
{
#ifdef RTP_SOCKETTYPE_WINSOCK
	unsigned long len;
#else 
	size_t len;
#endif // RTP_SOCKETTYPE_WINSOCK
	bool dataavailable;
	
	do
	{
		len = 0;
		RTPIOCTL(sock, FIONREAD, &len);

		if (len <= 0) 
			dataavailable = false;
		else
			dataavailable = true;
		
		if (dataavailable)
		{
			RTPTime curtime = RTPTime::CurrentTime();
			int relevantLen = RTPTCPTRANS_MAXPACKSIZE+2;
			
			if ((int)len < relevantLen)
				relevantLen = (int)len;

			bool complete = false;
			int status = sdata.ProcessAvailableBytes(sock, relevantLen, complete, GetMemoryManager());
			if (status < 0)
				return status;
			
			if (complete)
			{
				uint8_t *pBuf = sdata.ExtractDataBuffer();
				if (pBuf)
				{
					int dataLength = sdata.m_dataLength;
					sdata.Reset();

					RTPTCPAddress *pAddr = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_RTPADDRESS) RTPTCPAddress(sock);
					if (pAddr == 0)
						return ERR_RTP_OUTOFMEM;

					bool isrtp = true;
					if (dataLength > (int)sizeof(RTCPCommonHeader))
					{
						RTCPCommonHeader *rtcpheader = (RTCPCommonHeader *)pBuf;
						uint8_t packettype = rtcpheader->packettype;

						if (packettype >= 200 && packettype <= 204)
							isrtp = false;
					}
						
					RTPRawPacket *pPack = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_RTPRAWPACKET) RTPRawPacket(pBuf, dataLength, pAddr, curtime, isrtp, GetMemoryManager());
					if (pPack == 0)
					{
						RTPDelete(pAddr,GetMemoryManager());
						RTPDeleteByteArray(pBuf,GetMemoryManager());
						return ERR_RTP_OUTOFMEM;
					}
					m_rawpacketlist.push_back(pPack);	
				}
			}
		}
	} while (dataavailable);

	return 0;
}